

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>::
ParticleArrayTest_Back_Test
          (ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>
           *this)

{
  ParticleArrayTest<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_> *in_RDI;
  
  ParticleArrayTest<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>::ParticleArrayTest
            (in_RDI);
  (in_RDI->super_BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>).super_BaseFixture.
  super_Test._vptr_Test = (_func_int **)&PTR__ParticleArrayTest_Back_Test_002b03c0;
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}